

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentParser.hpp
# Opt level: O1

string * __thiscall
Utils::ArgumentParser::get_message_abi_cxx11_(string *__return_storage_ptr__,ArgumentParser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppVVar2;
  pointer ppAVar3;
  ArgumentParser *pAVar4;
  long *plVar5;
  size_type *psVar6;
  pointer ppVVar7;
  pointer ppAVar8;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  ArgumentParser *local_38;
  
  std::operator+(__return_storage_ptr__,"Usage: ",&this->program_name);
  if (((this->options).
       super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (this->options).
       super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>._M_impl.
       super__Vector_impl_data._M_finish) ||
     ((this->flags).super__Vector_base<Utils::ArgFlag_*,_std::allocator<Utils::ArgFlag_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->flags).super__Vector_base<Utils::ArgFlag_*,_std::allocator<Utils::ArgFlag_*>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  ppVVar7 = (this->positionals).
            super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppVVar2 = (this->positionals).
            super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_38 = this;
  if (ppVVar7 != ppVVar2) {
    do {
      std::operator+(&local_58," [",&((*ppVVar7)->super_ArgObject).name);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_58);
      psVar6 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_78.field_2._M_allocated_capacity = *psVar6;
        local_78.field_2._8_8_ = plVar5[3];
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      }
      else {
        local_78.field_2._M_allocated_capacity = *psVar6;
        local_78._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_78._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_78._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      ppVVar7 = ppVVar7 + 1;
    } while (ppVVar7 != ppVVar2);
  }
  pAVar4 = local_38;
  wrap_string(&local_58,&local_38->short_text,0,0x50);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x1175d5);
  paVar1 = &local_78.field_2;
  psVar6 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_78.field_2._M_allocated_capacity = *psVar6;
    local_78.field_2._8_8_ = plVar5[3];
    local_78._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_78.field_2._M_allocated_capacity = *psVar6;
    local_78._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_78._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  ppVVar2 = (pAVar4->positionals).
            super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppVVar7 = (pAVar4->positionals).
                 super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppVVar7 != ppVVar2; ppVVar7 = ppVVar7 + 1
      ) {
    (*((*ppVVar7)->super_ArgObject)._vptr_ArgObject[2])(&local_78);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  ppVVar2 = (pAVar4->options).
            super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppVVar7 = (pAVar4->options).
                 super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppVVar7 != ppVVar2; ppVVar7 = ppVVar7 + 1
      ) {
    (*((*ppVVar7)->super_ArgObject)._vptr_ArgObject[2])(&local_78);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  ppAVar3 = (pAVar4->flags).super__Vector_base<Utils::ArgFlag_*,_std::allocator<Utils::ArgFlag_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppAVar8 = (pAVar4->flags).
                 super__Vector_base<Utils::ArgFlag_*,_std::allocator<Utils::ArgFlag_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppAVar8 != ppAVar3; ppAVar8 = ppAVar8 + 1) {
    (*((*ppAVar8)->super_ArgObject)._vptr_ArgObject[2])(&local_78);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  wrap_string(&local_78,&pAVar4->long_text,0,0x50);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string ArgumentParser::get_message() const {

    std::string message("Usage: "+program_name);
    if  ( !options.empty() || !flags.empty() ) message+=" {OPTIONS}";
    for (auto i : positionals)                 message+=" ["+i->get_name()+"]";

    message += "\n" + wrap_string(short_text,0,80);
    message += "\nOptions:\n";

    for (auto i : positionals) { message += i->get_message(); }
    for (auto i : options)     { message += i->get_message(); }
    for (auto i : flags)       { message += i->get_message(); }

    message+= "\n";
    message += wrap_string(long_text,0,80);
    return message;
}